

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_adapt.c
# Opt level: O0

REF_STATUS ref_adapt_surf_to_geom(REF_GRID ref_grid,REF_INT passes)

{
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT pass;
  REF_BOOL all_done;
  REF_INT passes_local;
  REF_GRID ref_grid_local;
  
  ref_private_macro_code_rss = 0;
  pass = passes;
  _all_done = ref_grid;
  uVar1 = ref_migrate_to_balance(ref_grid);
  if (uVar1 == 0) {
    uVar1 = ref_metric_interpolated_curvature(_all_done);
    if (uVar1 == 0) {
      ref_mpi_stopwatch_stop(_all_done->mpi,"curvature");
      uVar1 = ref_adapt_tattle_faces(_all_done);
      if (uVar1 == 0) {
        ref_mpi_stopwatch_stop(_all_done->mpi,"tattle faces");
        for (ref_private_macro_code_rss_1 = 0;
            ref_private_macro_code_rss == 0 && ref_private_macro_code_rss_1 < pass;
            ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
          if (_all_done->mpi->id == 0) {
            printf("\n pass %d of %d with %d ranks\n",(ulong)(ref_private_macro_code_rss_1 + 1),
                   (ulong)(uint)pass,(ulong)(uint)_all_done->mpi->n);
          }
          uVar1 = ref_adapt_pass(_all_done,&ref_private_macro_code_rss);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                   ,0x337,"ref_adapt_surf_to_geom",(ulong)uVar1,"pass");
            return uVar1;
          }
          uVar1 = ref_migrate_to_balance(_all_done);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                   ,0x339,"ref_adapt_surf_to_geom",(ulong)uVar1,"migrate to single part");
            return uVar1;
          }
          uVar1 = ref_grid_pack(_all_done);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                   ,0x33a,"ref_adapt_surf_to_geom",(ulong)uVar1,"pack");
            return uVar1;
          }
          ref_mpi_stopwatch_stop(_all_done->mpi,"pack");
          uVar1 = ref_metric_interpolated_curvature(_all_done);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                   ,0x33d,"ref_adapt_surf_to_geom",(ulong)uVar1,"interp curve");
            return uVar1;
          }
          ref_mpi_stopwatch_stop(_all_done->mpi,"curvature");
          uVar1 = ref_adapt_tattle_faces(_all_done);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                   ,0x340,"ref_adapt_surf_to_geom",(ulong)uVar1,"tattle");
            return uVar1;
          }
          ref_mpi_stopwatch_stop(_all_done->mpi,"tattle faces");
        }
        ref_grid_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",
               0x330,"ref_adapt_surf_to_geom",(ulong)uVar1,"tattle");
        ref_grid_local._4_4_ = uVar1;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0x32e
             ,"ref_adapt_surf_to_geom",(ulong)uVar1,"interp curve");
      ref_grid_local._4_4_ = uVar1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0x32d,
           "ref_adapt_surf_to_geom",(ulong)uVar1,"migrate to single part");
    ref_grid_local._4_4_ = uVar1;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_adapt_surf_to_geom(REF_GRID ref_grid, REF_INT passes) {
  REF_BOOL all_done = REF_FALSE;
  REF_INT pass;

  RSS(ref_migrate_to_balance(ref_grid), "migrate to single part");
  RSS(ref_metric_interpolated_curvature(ref_grid), "interp curve");
  ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "curvature");
  RSS(ref_adapt_tattle_faces(ref_grid), "tattle");
  ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "tattle faces");

  for (pass = 0; !all_done && pass < passes; pass++) {
    if (ref_grid_once(ref_grid))
      printf("\n pass %d of %d with %d ranks\n", pass + 1, passes,
             ref_mpi_n(ref_grid_mpi(ref_grid)));
    RSS(ref_adapt_pass(ref_grid, &all_done), "pass");

    RSS(ref_migrate_to_balance(ref_grid), "migrate to single part");
    RSS(ref_grid_pack(ref_grid), "pack");
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "pack");

    RSS(ref_metric_interpolated_curvature(ref_grid), "interp curve");
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "curvature");

    RSS(ref_adapt_tattle_faces(ref_grid), "tattle");
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "tattle faces");
  }

  return REF_SUCCESS;
}